

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_get_hex(JSString *p,int k,int n)

{
  int c_00;
  uint uVar1;
  int in_EDX;
  int in_ESI;
  JSString *in_RDI;
  int h;
  int c;
  uint local_1c;
  int local_18;
  int local_14;
  
  local_1c = 0;
  local_18 = in_EDX;
  local_14 = in_ESI;
  while( true ) {
    if (local_18 < 1) {
      return local_1c;
    }
    c_00 = string_get(in_RDI,local_14);
    uVar1 = from_hex(c_00);
    if ((int)uVar1 < 0) break;
    local_1c = local_1c << 4 | uVar1;
    local_18 = local_18 + -1;
    local_14 = local_14 + 1;
  }
  return -1;
}

Assistant:

static int string_get_hex(JSString *p, int k, int n) {
    int c = 0, h;
    while (n-- > 0) {
        if ((h = from_hex(string_get(p, k++))) < 0)
            return -1;
        c = (c << 4) | h;
    }
    return c;
}